

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall
FOptionMenuTextField::MenuEvent(FOptionMenuTextField *this,int mkey,bool fromcontroller)

{
  FBaseCVar *this_00;
  bool bVar1;
  char *__src;
  DTextEnterMenu *this_01;
  FSoundID local_1c;
  
  if (mkey != 0xb) {
    if (mkey != 10) {
      if (mkey == 6) {
        local_1c.ID = S_FindSound("menu/choose");
        S_Sound(0x22,&local_1c,snd_menuvolume.Value,0.0);
        __src = FOptionMenuFieldBase::GetCVarString(&this->super_FOptionMenuFieldBase);
        strcpy(this->mEditName,__src);
        this->mEntering = true;
        this_01 = (DTextEnterMenu *)DObject::operator_new(0x58);
        DTextEnterMenu::DTextEnterMenu
                  (this_01,DMenu::CurrentMenu,this->mEditName,0x80,2,fromcontroller,false);
        M_ActivateMenu((DMenu *)this_01);
        return true;
      }
      bVar1 = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
      return bVar1;
    }
    this_00 = (this->super_FOptionMenuFieldBase).mCVar;
    if (this_00 != (FBaseCVar *)0x0) {
      FBaseCVar::SetGenericRep(this_00,(UCVarValue)this->mEditName,CVAR_String);
    }
  }
  this->mEntering = false;
  return true;
}

Assistant:

bool MenuEvent ( int mkey, bool fromcontroller )
	{
		if ( mkey == MKEY_Enter )
		{
			S_Sound( CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE );
			strcpy( mEditName, GetCVarString() );
			mEntering = true;
			DMenu* input = new DTextEnterMenu ( DMenu::CurrentMenu, mEditName, sizeof mEditName, 2, fromcontroller );
			M_ActivateMenu( input );
			return true;
		}
		else if ( mkey == MKEY_Input )
		{
			if ( mCVar )
			{
				UCVarValue vval;
				vval.String = mEditName;
				mCVar->SetGenericRep( vval, CVAR_String );
			}

			mEntering = false;
			return true;
		}
		else if ( mkey == MKEY_Abort )
		{
			mEntering = false;
			return true;
		}

		return FOptionMenuItem::MenuEvent( mkey, fromcontroller );
	}